

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialogPrivate::showDetailsView(QFileDialogPrivate *this)

{
  Ui_QFileDialog *pUVar1;
  QWidget *in_RDI;
  QWidget *unaff_retaddr;
  QWidget *this_00;
  
  this_00 = in_RDI;
  QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
            ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)
             (in_RDI + 0x16));
  QAbstractButton::setDown((QAbstractButton *)unaff_retaddr,SUB81((ulong)this_00 >> 0x38,0));
  QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
            ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)
             (in_RDI + 0x16));
  QAbstractButton::setDown((QAbstractButton *)unaff_retaddr,SUB81((ulong)this_00 >> 0x38,0));
  QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
            ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)
             (in_RDI + 0x16));
  QWidget::hide((QWidget *)0x75822a);
  QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
            ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)
             (in_RDI + 0x16));
  QWidget::show(unaff_retaddr);
  QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
            ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)
             (in_RDI + 0x16));
  QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
            ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)
             (in_RDI + 0x16));
  QWidget::parentWidget((QWidget *)0x75827d);
  QStackedWidget::setCurrentWidget((QStackedWidget *)this_00,in_RDI);
  pUVar1 = QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                     ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)
                      (in_RDI + 0x16));
  (**(code **)(*(long *)&(pUVar1->treeView->super_QTreeView).super_QAbstractItemView.
                         super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x220))();
  return;
}

Assistant:

void QFileDialogPrivate::showDetailsView()
{
    qFileDialogUi->listModeButton->setDown(false);
    qFileDialogUi->detailModeButton->setDown(true);
    qFileDialogUi->listView->hide();
    qFileDialogUi->treeView->show();
    qFileDialogUi->stackedWidget->setCurrentWidget(qFileDialogUi->treeView->parentWidget());
    qFileDialogUi->treeView->doItemsLayout();
}